

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode AcceptServerConnect(Curl_easy *data)

{
  connectdata *conn_00;
  int iVar1;
  socklen_t local_ac;
  int error;
  curl_socklen_t size;
  Curl_sockaddr_storage add;
  curl_socket_t s;
  curl_socket_t sock;
  connectdata *conn;
  Curl_easy *data_local;
  
  conn_00 = data->conn;
  add.buffer.sa_stor.__ss_align._4_4_ = conn_00->sock[1];
  add.buffer.sa_stor.__ss_align._0_4_ = 0xffffffff;
  local_ac = 0x80;
  iVar1 = getsockname(add.buffer.sa_stor.__ss_align._4_4_,(sockaddr *)&error,&local_ac);
  if (iVar1 == 0) {
    local_ac = 0x80;
    add.buffer.sa_stor.__ss_align._0_4_ =
         accept(add.buffer.sa_stor.__ss_align._4_4_,(sockaddr *)&error,&local_ac);
  }
  Curl_closesocket(data,conn_00,add.buffer.sa_stor.__ss_align._4_4_);
  if (add.buffer.sa_stor.__ss_align._0_4_ == -1) {
    Curl_failf(data,"Error accept()ing server connect");
    data_local._4_4_ = CURLE_FTP_PORT_FAILED;
  }
  else {
    Curl_infof(data,"Connection accepted from server");
    *(uint *)&(conn_00->bits).field_0x4 = *(uint *)&(conn_00->bits).field_0x4 & 0xffffdfff;
    conn_00->sock[1] = add.buffer.sa_stor.__ss_align._0_4_;
    curlx_nonblock(add.buffer.sa_stor.__ss_align._0_4_,1);
    *(uint *)&(conn_00->bits).field_0x4 =
         *(uint *)&(conn_00->bits).field_0x4 & 0xdfffffff | 0x20000000;
    if ((data->set).fsockopt != (curl_sockopt_callback)0x0) {
      Curl_set_in_callback(data,true);
      iVar1 = (*(data->set).fsockopt)
                        ((data->set).sockopt_client,add.buffer.sa_stor.__ss_align._0_4_,
                         CURLSOCKTYPE_ACCEPT);
      Curl_set_in_callback(data,false);
      if (iVar1 != 0) {
        close_secondarysocket(data,conn_00);
        return CURLE_ABORTED_BY_CALLBACK;
      }
    }
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode AcceptServerConnect(struct Curl_easy *data)
{
  struct connectdata *conn = data->conn;
  curl_socket_t sock = conn->sock[SECONDARYSOCKET];
  curl_socket_t s = CURL_SOCKET_BAD;
#ifdef ENABLE_IPV6
  struct Curl_sockaddr_storage add;
#else
  struct sockaddr_in add;
#endif
  curl_socklen_t size = (curl_socklen_t) sizeof(add);

  if(0 == getsockname(sock, (struct sockaddr *) &add, &size)) {
    size = sizeof(add);

    s = accept(sock, (struct sockaddr *) &add, &size);
  }
  Curl_closesocket(data, conn, sock); /* close the first socket */

  if(CURL_SOCKET_BAD == s) {
    failf(data, "Error accept()ing server connect");
    return CURLE_FTP_PORT_FAILED;
  }
  infof(data, "Connection accepted from server");
  /* when this happens within the DO state it is important that we mark us as
     not needing DO_MORE anymore */
  conn->bits.do_more = FALSE;

  conn->sock[SECONDARYSOCKET] = s;
  (void)curlx_nonblock(s, TRUE); /* enable non-blocking */
  conn->bits.sock_accepted = TRUE;

  if(data->set.fsockopt) {
    int error = 0;

    /* activate callback for setting socket options */
    Curl_set_in_callback(data, true);
    error = data->set.fsockopt(data->set.sockopt_client,
                               s,
                               CURLSOCKTYPE_ACCEPT);
    Curl_set_in_callback(data, false);

    if(error) {
      close_secondarysocket(data, conn);
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }

  return CURLE_OK;

}